

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void anon_unknown.dwarf_64ed::prepareEnv
               (Map<String,_String> *environment,Array<String> *envStringsBuf)

{
  usize *puVar1;
  Item *pIVar2;
  Item *this;
  String local_80;
  String local_58;
  
  Array<String>::reserve(envStringsBuf,environment->_size);
  pIVar2 = (environment->_end).item;
  this = (environment->_begin).item;
  if (this != pIVar2) {
    do {
      String::operator+(&local_80,&this->key,(char (*) [2])"=");
      String::operator+(&local_58,&local_80,&this->value);
      Array<String>::append(envStringsBuf,&local_58);
      if ((local_58.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_58.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
          operator_delete__(local_58.data);
        }
      }
      if ((local_80.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_80.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
          operator_delete__(local_80.data);
        }
      }
      this = this->next;
    } while (this != pIVar2);
  }
  return;
}

Assistant:

void prepareEnv(const Map<String, String>& environment, Array<String>& envStringsBuf)
  {
    envStringsBuf.reserve(environment.size());
      for (Map<String, String>::Iterator i = environment.begin(), end = environment.end(); i != end; ++i)
        envStringsBuf.append(i.key() + "=" + *i);
  }